

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

void ncnn::im2col_sgemm_pack8to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int *piVar12;
  uint uVar13;
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  undefined8 *puVar22;
  long lVar23;
  undefined1 (*pauVar24) [32];
  long lVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  undefined8 *puVar28;
  int iVar29;
  undefined1 (*pauVar30) [32];
  long lVar31;
  int iVar32;
  int nn;
  int iVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  Mat local_88;
  ulong local_38;
  
  uVar2 = bottom_im2col->w;
  uVar19 = (ulong)(int)uVar2;
  iVar33 = bottom_im2col->h;
  uVar17 = bottom_im2col->c;
  uVar15 = (ulong)uVar17;
  local_38 = (ulong)(uint)top_blob->c;
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize = 0;
  local_88.elempack = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  if ((long)uVar19 < 4) {
    uVar13 = uVar2;
    iVar32 = iVar33;
    if (1 < (int)uVar2) {
      iVar32 = iVar33 * 2;
      uVar13 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar13 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    iVar32 = iVar33 * 4;
  }
  Mat::create(&local_88,iVar32,uVar17,uVar13,8,8,opt->workspace_allocator);
  uVar13 = (int)uVar2 >> 2;
  if (0 < (int)uVar13) {
    lVar20 = 0;
    uVar21 = 0;
    do {
      if (0 < (int)uVar17) {
        pauVar24 = (undefined1 (*) [32])
                   (local_88.cstep * uVar21 * local_88.elemsize + (long)local_88.data);
        uVar26 = 0;
        do {
          if (0 < iVar33) {
            pauVar30 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + lVar20);
            iVar32 = iVar33;
            do {
              *pauVar24 = *pauVar30;
              pauVar24 = pauVar24 + 1;
              pauVar30 = (undefined1 (*) [32])(*pauVar30 + uVar19 * 8);
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar15);
      }
      uVar21 = uVar21 + 1;
      lVar20 = lVar20 + 0x20;
    } while (uVar21 != uVar13);
  }
  uVar16 = uVar2 >> 1 & 1;
  if ((uVar16 != 0) && (0 < (int)uVar17)) {
    pauVar14 = (undefined1 (*) [16])
               ((long)(int)uVar13 * local_88.cstep * local_88.elemsize + (long)local_88.data);
    uVar21 = 0;
    do {
      if (0 < iVar33) {
        pauVar27 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar21 +
                   (uVar19 & 0xfffffffffffffffc) * 8);
        iVar32 = iVar33;
        do {
          *pauVar14 = *pauVar27;
          pauVar14 = pauVar14 + 1;
          pauVar27 = (undefined1 (*) [16])(*pauVar27 + uVar19 * 8);
          iVar32 = iVar32 + -1;
        } while (iVar32 != 0);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar15);
  }
  iVar32 = (int)(uVar19 & 0xfffffffffffffffc) + uVar16 * 2;
  if (iVar32 < (int)uVar2) {
    uVar21 = (ulong)iVar32;
    pvVar18 = (void *)(uVar21 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)uVar17) {
        uVar16 = (uint)uVar21;
        uVar13 = uVar16 + 3;
        if (-1 < (int)uVar16) {
          uVar13 = uVar16;
        }
        puVar22 = (undefined8 *)
                  ((long)(int)((int)(uVar16 - (uVar13 & 0xfffffffc)) / 2 +
                              ((int)uVar13 >> 2) +
                              (uVar16 - (((uint)(uVar21 >> 0x1f) & 1) + uVar16 & 0xfffffffe))) *
                   local_88.cstep * local_88.elemsize + (long)local_88.data);
        uVar26 = 0;
        do {
          if (0 < iVar33) {
            puVar28 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + (long)pvVar18);
            iVar32 = iVar33;
            do {
              *puVar22 = *puVar28;
              puVar22 = puVar22 + 1;
              puVar28 = puVar28 + uVar19;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar15);
      }
      uVar21 = uVar21 + 1;
      pvVar18 = (void *)((long)pvVar18 + 8);
    } while (uVar21 != uVar19);
  }
  if (0 < (int)local_38) {
    iVar33 = uVar17 * iVar33;
    uVar15 = 0;
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x603000007020000));
    auVar51 = ZEXT3264(auVar7);
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x60300000702));
    auVar36 = ZEXT3264(auVar7);
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x401000005000000));
    auVar37 = ZEXT3264(auVar7);
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x40100000500));
    do {
      pauVar24 = (undefined1 (*) [32])
                 (top_blob->cstep * uVar15 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar2 < 4) {
        uVar21 = 0;
      }
      else {
        lVar20 = 0;
        uVar26 = 0;
        do {
          auVar35 = auVar36._0_32_;
          auVar50 = auVar51._0_32_;
          if (iVar33 < 1) {
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar39 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar46 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar48 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar34 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            lVar23 = local_88.cstep * local_88.elemsize * lVar20;
            lVar25 = kernel->cstep * uVar15 * kernel->elemsize;
            auVar43 = ZEXT1664((undefined1  [16])0x0);
            lVar31 = 0;
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            auVar51 = ZEXT1664((undefined1  [16])0x0);
            auVar37 = ZEXT1664((undefined1  [16])0x0);
            auVar36 = ZEXT1664((undefined1  [16])0x0);
            iVar32 = iVar33;
            do {
              auVar46 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)local_88.data + lVar31 + lVar23)
                                      );
              auVar40 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)kernel->data + lVar31 + lVar25))
              ;
              auVar38 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar31 + lVar25 + 0x10));
              auVar34 = vpmaddwd_avx2(auVar46,auVar40);
              auVar34 = vpaddd_avx2(auVar34,auVar43._0_32_);
              auVar43 = ZEXT3264(auVar34);
              auVar44 = vpermq_avx2(auVar46,0x4e);
              auVar48 = vpmaddwd_avx2(auVar44,auVar40);
              auVar48 = vpaddd_avx2(auVar49._0_32_,auVar48);
              auVar49 = ZEXT3264(auVar48);
              auVar46 = vpmaddwd_avx2(auVar46,auVar38);
              auVar46 = vpaddd_avx2(auVar47._0_32_,auVar46);
              auVar47 = ZEXT3264(auVar46);
              auVar44 = vpmaddwd_avx2(auVar44,auVar38);
              auVar39 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)local_88.data + lVar31 + lVar23 + 0x10));
              auVar44 = vpaddd_avx2(auVar45._0_32_,auVar44);
              auVar45 = ZEXT3264(auVar44);
              auVar41 = vpmaddwd_avx2(auVar39,auVar40);
              auVar41 = vpaddd_avx2(auVar41,auVar42._0_32_);
              auVar42 = ZEXT3264(auVar41);
              auVar11 = vpermq_avx2(auVar39,0x4e);
              auVar40 = vpmaddwd_avx2(auVar40,auVar11);
              auVar40 = vpaddd_avx2(auVar40,auVar51._0_32_);
              auVar51 = ZEXT3264(auVar40);
              auVar39 = vpmaddwd_avx2(auVar39,auVar38);
              auVar39 = vpaddd_avx2(auVar39,auVar37._0_32_);
              auVar37 = ZEXT3264(auVar39);
              auVar38 = vpmaddwd_avx2(auVar38,auVar11);
              auVar38 = vpaddd_avx2(auVar38,auVar36._0_32_);
              auVar36 = ZEXT3264(auVar38);
              lVar31 = lVar31 + 0x20;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
          }
          auVar11 = vpunpckldq_avx2(auVar34,auVar48);
          auVar8 = vpunpckldq_avx2(auVar46,auVar44);
          auVar48 = vpunpckhdq_avx2(auVar34,auVar48);
          auVar44 = vpunpckhdq_avx2(auVar46,auVar44);
          auVar9 = vpunpckldq_avx2(auVar41,auVar40);
          auVar10 = vpunpckldq_avx2(auVar39,auVar38);
          auVar41 = vpunpckhdq_avx2(auVar41,auVar40);
          auVar40 = vpunpckhdq_avx2(auVar39,auVar38);
          auVar51 = ZEXT3264(auVar50);
          auVar34 = vpermd_avx2(auVar50,auVar8);
          auVar36 = ZEXT3264(auVar35);
          auVar46 = vpermd_avx2(auVar35,auVar11);
          auVar34 = vpblendd_avx2(auVar46,auVar34,0xcc);
          auVar46 = vpmovsxbd_avx2(ZEXT816(0x401000005000000));
          auVar37 = ZEXT3264(auVar46);
          auVar39 = vpermd_avx2(auVar46,auVar8);
          auVar38 = vpermd_avx2(auVar7,auVar11);
          auVar39 = vpblendd_avx2(auVar38,auVar39,0xcc);
          auVar34 = vpaddd_avx2(auVar39,auVar34);
          auVar39 = vpermd_avx2(auVar50,auVar44);
          auVar38 = vpermd_avx2(auVar35,auVar48);
          auVar39 = vpblendd_avx2(auVar38,auVar39,0xcc);
          auVar44 = vpermd_avx2(auVar46,auVar44);
          auVar48 = vpermd_avx2(auVar7,auVar48);
          auVar48 = vpblendd_avx2(auVar48,auVar44,0xcc);
          auVar48 = vpaddd_avx2(auVar39,auVar48);
          auVar34 = vpaddd_avx2(auVar34,auVar48);
          auVar48 = vpermd_avx2(auVar50,auVar10);
          auVar44 = vpermd_avx2(auVar35,auVar9);
          auVar48 = vpblendd_avx2(auVar44,auVar48,0xcc);
          auVar44 = vpermd_avx2(auVar46,auVar10);
          auVar39 = vpermd_avx2(auVar7,auVar9);
          auVar44 = vpblendd_avx2(auVar39,auVar44,0xcc);
          auVar48 = vpaddd_avx2(auVar44,auVar48);
          auVar50 = vpermd_avx2(auVar50,auVar40);
          auVar35 = vpermd_avx2(auVar35,auVar41);
          auVar35 = vpblendd_avx2(auVar35,auVar50,0xcc);
          auVar50 = vpermd_avx2(auVar46,auVar40);
          auVar46 = vpermd_avx2(auVar7,auVar41);
          auVar50 = vpblendd_avx2(auVar46,auVar50,0xcc);
          auVar35 = vpaddd_avx2(auVar35,auVar50);
          auVar35 = vpaddd_avx2(auVar48,auVar35);
          *pauVar24 = auVar34;
          pauVar24[1] = auVar35;
          pauVar24 = pauVar24 + 2;
          uVar21 = uVar26 + 4;
          lVar23 = uVar26 + 7;
          lVar20 = lVar20 + 1;
          uVar26 = uVar21;
        } while (lVar23 < (long)uVar19);
      }
      if ((int)((uint)uVar21 | 1) < (int)uVar2) {
        uVar17 = 0;
        do {
          iVar32 = (int)uVar21;
          if (iVar33 < 1) {
            auVar35 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar50 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar34 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar48 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            lVar20 = kernel->cstep * uVar15 * kernel->elemsize;
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            lVar23 = 0;
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar43 = ZEXT1664((undefined1  [16])0x0);
            iVar29 = iVar33;
            do {
              auVar34 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)local_88.data +
                                        lVar23 + local_88.cstep * local_88.elemsize *
                                                 (ulong)((uVar17 & 1) +
                                                        ((uint)(uVar21 >> 2) & 0x3fffffff))));
              auVar50 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar23 * 2 + lVar20));
              auVar48 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar23 * 2 + lVar20 + 0x10));
              auVar35 = vpmaddwd_avx2(auVar50,auVar34);
              auVar35 = vpaddd_avx2(auVar35,auVar43._0_32_);
              auVar43 = ZEXT3264(auVar35);
              auVar46 = vpermq_avx2(auVar34,0x4e);
              auVar50 = vpmaddwd_avx2(auVar46,auVar50);
              auVar50 = vpaddd_avx2(auVar50,auVar47._0_32_);
              auVar47 = ZEXT3264(auVar50);
              auVar34 = vpmaddwd_avx2(auVar48,auVar34);
              auVar34 = vpaddd_avx2(auVar34,auVar45._0_32_);
              auVar45 = ZEXT3264(auVar34);
              auVar48 = vpmaddwd_avx2(auVar46,auVar48);
              auVar48 = vpaddd_avx2(auVar48,auVar42._0_32_);
              auVar42 = ZEXT3264(auVar48);
              lVar23 = lVar23 + 0x10;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          auVar46 = vpunpckldq_avx2(auVar35,auVar50);
          auVar44 = vpunpckldq_avx2(auVar34,auVar48);
          auVar50 = vpunpckhdq_avx2(auVar35,auVar50);
          auVar34 = vpunpckhdq_avx2(auVar34,auVar48);
          auVar35 = vpermd_avx2(auVar51._0_32_,auVar44);
          auVar48 = vpermd_avx2(auVar36._0_32_,auVar46);
          auVar35 = vpblendd_avx2(auVar48,auVar35,0xcc);
          auVar48 = vpermd_avx2(auVar37._0_32_,auVar44);
          auVar46 = vpermd_avx2(auVar7,auVar46);
          auVar48 = vpblendd_avx2(auVar46,auVar48,0xcc);
          auVar35 = vpaddd_avx2(auVar48,auVar35);
          auVar48 = vpermd_avx2(auVar51._0_32_,auVar34);
          auVar46 = vpermd_avx2(auVar36._0_32_,auVar50);
          auVar48 = vpblendd_avx2(auVar46,auVar48,0xcc);
          auVar34 = vpermd_avx2(auVar37._0_32_,auVar34);
          auVar50 = vpermd_avx2(auVar7,auVar50);
          auVar50 = vpblendd_avx2(auVar50,auVar34,0xcc);
          auVar50 = vpaddd_avx2(auVar48,auVar50);
          auVar35 = vpaddd_avx2(auVar35,auVar50);
          *pauVar24 = auVar35;
          pauVar24 = pauVar24 + 1;
          uVar13 = iVar32 + 2;
          uVar26 = (ulong)uVar13;
          uVar17 = (uint)(byte)((char)uVar17 + 1);
          uVar21 = (ulong)uVar13;
        } while (iVar32 + 3 < (int)uVar2);
      }
      else {
        uVar26 = uVar21 & 0xffffffff;
      }
      if ((int)uVar26 < (int)uVar2) {
        do {
          uVar17 = (uint)uVar26;
          if (iVar33 < 1) {
            auVar35 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar50 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar14 = (undefined1 (*) [16])
                       (kernel->cstep * uVar15 * kernel->elemsize + (long)kernel->data);
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            lVar20 = 0;
            auVar43 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)((long)local_88.data +
                                       lVar20 * 8 +
                                       local_88.cstep * local_88.elemsize *
                                       (ulong)((uVar17 & 1) + (int)(uVar26 >> 2) +
                                              (uint)((uVar17 >> 1 & 1) != 0)));
              auVar1 = vpmovsxbw_avx(auVar1);
              auVar35 = vpmovsxbw_avx2(*pauVar14);
              auVar50 = vpmovsxbw_avx2(pauVar14[1]);
              auVar34._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar1;
              auVar34._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
              auVar35 = vpmaddwd_avx2(auVar34,auVar35);
              auVar35 = vpaddd_avx2(auVar35,auVar43._0_32_);
              auVar43 = ZEXT3264(auVar35);
              auVar50 = vpmaddwd_avx2(auVar34,auVar50);
              auVar50 = vpaddd_avx2(auVar50,auVar42._0_32_);
              auVar42 = ZEXT3264(auVar50);
              pauVar14 = pauVar14 + 2;
              lVar20 = lVar20 + 1;
            } while (iVar33 != (int)lVar20);
          }
          auVar1 = vpunpckldq_avx(auVar35._0_16_,auVar35._16_16_);
          auVar5 = vpunpckldq_avx(auVar50._0_16_,auVar50._16_16_);
          auVar3 = vpunpckhdq_avx(auVar35._0_16_,auVar35._16_16_);
          auVar4 = vpunpckhdq_avx(auVar50._0_16_,auVar50._16_16_);
          auVar6 = vpunpcklqdq_avx(auVar1,auVar5);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar5);
          auVar1 = vpaddd_avx(auVar6,auVar1);
          auVar5 = vpunpcklqdq_avx(auVar3,auVar4);
          auVar3 = vpunpckhqdq_avx(auVar3,auVar4);
          auVar3 = vpaddd_avx(auVar3,auVar5);
          auVar1 = vpaddd_avx(auVar1,auVar3);
          *(undefined1 (*) [16])*pauVar24 = auVar1;
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + 0x10);
          uVar26 = (ulong)(uVar17 + 1);
        } while (uVar17 + 1 != uVar2);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_38);
  }
  piVar12 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}